

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t zipx_bzip2_init(archive_read *a,zip *zip)

{
  uint uVar1;
  uchar *puVar2;
  wchar_t r;
  zip *zip_local;
  archive_read *a_local;
  
  if (zip->bzstream_valid != '\0') {
    BZ2_bzDecompressEnd(&zip->bzstream);
    zip->bzstream_valid = '\0';
  }
  memset(&zip->bzstream,0,0x50);
  uVar1 = BZ2_bzDecompressInit(&zip->bzstream,0,1);
  if (uVar1 == 0) {
    zip->bzstream_valid = '\x01';
    free(zip->uncompressed_buffer);
    zip->uncompressed_buffer_size = 0x40000;
    puVar2 = (uchar *)malloc(zip->uncompressed_buffer_size);
    zip->uncompressed_buffer = puVar2;
    if (zip->uncompressed_buffer == (uchar *)0x0) {
      archive_set_error(&a->archive,0xc,"No memory for bzip2 decompression");
      a_local._4_4_ = L'\xffffffe2';
    }
    else {
      zip->decompress_init = '\x01';
      a_local._4_4_ = L'\0';
    }
  }
  else {
    archive_set_error(&a->archive,-1,"bzip2 initialization failed(%d)",(ulong)uVar1);
    a_local._4_4_ = L'\xffffffe7';
  }
  return a_local._4_4_;
}

Assistant:

static int
zipx_bzip2_init(struct archive_read *a, struct zip *zip)
{
	int r;

	/* Deallocate already existing BZ2 decompression context if it
	 * exists. */
	if(zip->bzstream_valid) {
		BZ2_bzDecompressEnd(&zip->bzstream);
		zip->bzstream_valid = 0;
	}

	/* Allocate a new BZ2 decompression context. */
	memset(&zip->bzstream, 0, sizeof(bz_stream));
	r = BZ2_bzDecompressInit(&zip->bzstream, 0, 1);
	if(r != BZ_OK) {
		archive_set_error(&(a->archive), ARCHIVE_ERRNO_MISC,
		    "bzip2 initialization failed(%d)",
		    r);

		return ARCHIVE_FAILED;
	}

	/* Mark the bzstream field to be released in cleanup phase. */
	zip->bzstream_valid = 1;

	/* (Re)allocate the buffer that will contain decompressed bytes. */
	free(zip->uncompressed_buffer);

	zip->uncompressed_buffer_size = 256 * 1024;
	zip->uncompressed_buffer =
	    (uint8_t*) malloc(zip->uncompressed_buffer_size);
	if (zip->uncompressed_buffer == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "No memory for bzip2 decompression");
		    return ARCHIVE_FATAL;
	}

	/* Initialization done. */
	zip->decompress_init = 1;
	return ARCHIVE_OK;
}